

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O2

void __thiscall
fizplex::SimplexTest_LowerRowUpperVarOptimalSolution_Test::TestBody
          (SimplexTest_LowerRowUpperVarOptimalSolution_Test *this)

{
  LP *this_00;
  char *pcVar1;
  initializer_list<double> l;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  AssertionResult gtest_ar;
  DVector local_30;
  
  this_00 = &(this->super_SimplexTest).lp;
  LP::add_column(this_00,UpperBound,-INFINITY,0.0,1.0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0xc0000000000000;
  l._M_len = 1;
  l._M_array = (iterator)&gtest_ar;
  DVector::DVector(&local_30,l);
  LP::add_row(this_00,LE,-INFINITY,14.0,&local_30);
  operator_delete(local_30.vals._M_data);
  SimplexTest::solve_lp(&this->super_SimplexTest);
  local_50.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<fizplex::Simplex::Result,fizplex::Simplex::Result>
            ((internal *)&gtest_ar,"Simplex::Result::OptimalSolution","result",(Result *)&local_50,
             &(this->super_SimplexTest).result);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x23,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"-7.0","z",-7.0,(this->super_SimplexTest).z);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x24,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SimplexTest, LowerRowUpperVarOptimalSolution) {
  lp.add_column(ColType::UpperBound, -inf, 0.0, 1);
  lp.add_row(RowType::LE, -inf, 14, {-2});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-7.0, z);
}